

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationProcessing.hpp
# Opt level: O3

char processOperation(char b,char a,string *op)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (op,"+");
  if (iVar2 == 0) {
    bVar1 = a + b;
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (op,"-");
    if (iVar2 == 0) {
      bVar1 = a - b;
    }
    else {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(op,"*");
      if (iVar2 == 0) {
        bVar1 = a * b;
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(op,"/");
        if (iVar2 == 0) {
          bVar1 = a / b;
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(op,"**");
          if (iVar2 == 0) {
            dVar3 = pow((double)(int)a,(double)(int)b);
            bVar1 = (byte)(int)dVar3;
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(op,"%");
            if (iVar2 == 0) {
              bVar1 = a % b;
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (op,"&");
              if (iVar2 == 0) {
                bVar1 = a & b;
              }
              else {
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (op,"|");
                if (iVar2 == 0) {
                  bVar1 = a | b;
                }
                else {
                  iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (op,"^");
                  if (iVar2 == 0) {
                    bVar1 = a ^ b;
                  }
                  else {
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(op,">>");
                    if (iVar2 == 0) {
                      bVar1 = (byte)((int)b >> (a & 0x1fU));
                    }
                    else {
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (op,"<<");
                      bVar1 = b << (a & 0x1fU);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

char processOperation(char b, char a, string op) {
	if (op == "+") {
		return a + b;
	}
	if (op == "-") {
		return a - b;
	}
	if (op == "*") {
		return a * b;
	}
	if (op == "/") {
		return a / b;
	}
	if (op == "**") {
		return pow(a, b);
	}
	if (op == "%") {
		return a % b;
	}
	if (op == "&") {
		return b & a;
	}
	if (op == "|") {
		return b | a;
	}
	if (op == "^") {
		return b ^ a;
	}
	if (op == ">>") {
		return b >> a;
	}
	if (op == "<<") {
		return b << a;
	}
}